

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall dxil_spv::CFGNode::can_backtrace_to(CFGNode *this,CFGNode *parent)

{
  undefined1 local_58 [8];
  UnorderedSet<const_CFGNode_*> node_cache;
  CFGNode *parent_local;
  CFGNode *this_local;
  
  if (parent->forward_post_visit_order < this->forward_post_visit_order) {
    this_local._7_1_ = false;
  }
  else {
    node_cache._M_h._M_single_bucket = (__node_base_ptr)parent;
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::unordered_set((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                     *)local_58);
    this_local._7_1_ =
         can_backtrace_to(this,(CFGNode *)node_cache._M_h._M_single_bucket,
                          (UnorderedSet<const_CFGNode_*> *)local_58);
    std::
    unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
    ::~unordered_set((unordered_set<const_dxil_spv::CFGNode_*,_std::hash<const_dxil_spv::CFGNode_*>,_std::equal_to<const_dxil_spv::CFGNode_*>,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>_>
                      *)local_58);
  }
  return this_local._7_1_;
}

Assistant:

bool CFGNode::can_backtrace_to(const CFGNode *parent) const
{
	// If parent can branch to this, then post_order(parent) must be greater than post_order(this).
	if (parent->forward_post_visit_order < forward_post_visit_order)
		return false;

	UnorderedSet<const CFGNode *> node_cache;
	return can_backtrace_to(parent, node_cache);
}